

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_is_null.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformNullTest(Transformer *this,PGNullTest *root)

{
  int iVar1;
  Transformer *this_00;
  type expr;
  NotImplementedException *this_01;
  long in_RDX;
  pointer *__ptr;
  undefined1 local_58 [24];
  string local_40;
  
  TransformExpression((Transformer *)local_58,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
  if (*(char *)(in_RDX + 0x14) != '\x01') {
    iVar1 = *(int *)(in_RDX + 0x10);
    this_00 = (Transformer *)operator_new(0x50);
    local_40._M_dataplus._M_p = (pointer)local_58._0_8_;
    local_58._0_8_ = (Transformer *)0x0;
    local_58._8_8_ = (ParserOptions *)0x0;
    OperatorExpression::OperatorExpression
              ((OperatorExpression *)this_00,OPERATOR_IS_NOT_NULL - (iVar1 == 0),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_58 + 0x18),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_58 + 8));
    local_58._16_8_ = this_00;
    if ((ParserOptions *)local_58._8_8_ != (ParserOptions *)0x0) {
      (**(code **)(*(long *)local_58._8_8_ + 8))();
    }
    local_58._8_8_ = (ParserOptions *)0x0;
    if ((Transformer *)local_40._M_dataplus._M_p != (Transformer *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
    expr = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
           ::operator*((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                        *)(local_58 + 0x10));
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x18));
    (this->parent).ptr = (Transformer *)local_58._16_8_;
    if ((Transformer *)local_58._0_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_58._0_8_)->ptr->options)();
    }
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           this;
  }
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_58 + 0x18),"IS NULL argisrow","");
  NotImplementedException::NotImplementedException(this_01,(string *)(local_58 + 0x18));
  __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformNullTest(duckdb_libpgquery::PGNullTest &root) {
	auto arg = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.arg));
	if (root.argisrow) {
		throw NotImplementedException("IS NULL argisrow");
	}
	ExpressionType expr_type = (root.nulltesttype == duckdb_libpgquery::PG_IS_NULL)
	                               ? ExpressionType::OPERATOR_IS_NULL
	                               : ExpressionType::OPERATOR_IS_NOT_NULL;

	auto result = make_uniq<OperatorExpression>(expr_type, std::move(arg));
	SetQueryLocation(*result, root.location);
	return std::move(result);
}